

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementCableANCF::ComputeInternalForces_Impl(chrono::ChVector<double>const&,chrono::
ChVector<double>const&,chrono::ChVector<double>const&,chrono::ChVector<double>const&,chrono::
ChVector<double>const&,chrono::ChVector<double>const&,chrono::ChVector<double>const&,chrono::
ChVector<double>const&,Eigen::Matrix<double,-1,1,0,-1,1>&)::CableANCF_ForceCurv::Evaluate(Eigen::
Matrix<double,12,1,0,12,1>__double_(void *this,ChVectorN<double,_12> *result,double x)

{
  long *plVar1;
  ulong *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double *pdVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  double dVar47;
  double dVar48;
  double dVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar57;
  undefined1 auVar52 [16];
  double dVar56;
  double dVar58;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  double dVar59;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  double dVar60;
  double dVar66;
  double dVar67;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  double dVar88;
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 in_XMM23 [16];
  ChVector<double> vr_xx;
  ChVector<double> vr_x;
  double local_f8;
  double local_d8;
  long lStack_d0;
  undefined1 local_98 [16];
  undefined1 local_88 [32];
  ChVector<double> local_68;
  ChVector<double> local_48;
  
  (**(code **)(**(long **)((long)this + 8) + 0xe0))(*(long **)((long)this + 8),(long)this + 0x260);
  (**(code **)(**(long **)((long)this + 8) + 0xe8))(x,*(long **)((long)this + 8),(long)this + 0x280)
  ;
  auVar22 = _DAT_00982b40;
  lVar21 = 0;
  *(undefined8 *)((long)this + 0x100) = 0;
  *(undefined8 *)((long)this + 0x108) = 0;
  *(undefined8 *)((long)this + 0x110) = 0;
  *(undefined8 *)((long)this + 0x118) = 0;
  *(undefined8 *)((long)this + 0x120) = 0;
  *(undefined8 *)((long)this + 0x128) = 0;
  *(undefined8 *)((long)this + 0x130) = 0;
  *(undefined8 *)((long)this + 0x138) = 0;
  *(undefined8 *)((long)this + 0xe0) = 0;
  *(undefined8 *)((long)this + 0xe8) = 0;
  *(undefined8 *)((long)this + 0xf0) = 0;
  *(undefined8 *)((long)this + 0xf8) = 0;
  *(undefined8 *)((long)this + 0x100) = 0;
  *(undefined8 *)((long)this + 0x108) = 0;
  *(undefined8 *)((long)this + 0x110) = 0;
  *(undefined8 *)((long)this + 0x118) = 0;
  *(undefined8 *)((long)this + 0xa0) = 0;
  *(undefined8 *)((long)this + 0xa8) = 0;
  *(undefined8 *)((long)this + 0xb0) = 0;
  *(undefined8 *)((long)this + 0xb8) = 0;
  *(undefined8 *)((long)this + 0xc0) = 0;
  *(undefined8 *)((long)this + 200) = 0;
  *(undefined8 *)((long)this + 0xd0) = 0;
  *(undefined8 *)((long)this + 0xd8) = 0;
  *(undefined8 *)((long)this + 0x60) = 0;
  *(undefined8 *)((long)this + 0x68) = 0;
  *(undefined8 *)((long)this + 0x70) = 0;
  *(undefined8 *)((long)this + 0x78) = 0;
  *(undefined8 *)((long)this + 0x80) = 0;
  *(undefined8 *)((long)this + 0x88) = 0;
  *(undefined8 *)((long)this + 0x90) = 0;
  *(undefined8 *)((long)this + 0x98) = 0;
  *(undefined8 *)((long)this + 0x20) = 0;
  *(undefined8 *)((long)this + 0x28) = 0;
  *(undefined8 *)((long)this + 0x30) = 0;
  *(undefined8 *)((long)this + 0x38) = 0;
  *(undefined8 *)((long)this + 0x40) = 0;
  *(undefined8 *)((long)this + 0x48) = 0;
  *(undefined8 *)((long)this + 0x50) = 0;
  *(undefined8 *)((long)this + 0x58) = 0;
  auVar53 = *(undefined1 (*) [32])((long)this + 0x260);
  vscatterdpd_avx512vl
            (ZEXT832(this) + ZEXT832(0x20) + ZEXT1632(auVar22) * (undefined1  [32])0x8,0xffff,
             auVar53);
  vscatterdpd_avx512vl
            (ZEXT832(this) + ZEXT832(0x88) + ZEXT1632(auVar22) * (undefined1  [32])0x8,0xffff,
             auVar53);
  auVar63 = ZEXT1632(auVar22);
  vscatterdpd_avx512vl
            (ZEXT832(this) + ZEXT832(0xf0) + auVar63 * (undefined1  [32])0x8,0xffff,auVar53);
  *(undefined8 *)((long)this + 0x220) = 0;
  *(undefined8 *)((long)this + 0x228) = 0;
  *(undefined8 *)((long)this + 0x230) = 0;
  *(undefined8 *)((long)this + 0x238) = 0;
  *(undefined8 *)((long)this + 0x240) = 0;
  *(undefined8 *)((long)this + 0x248) = 0;
  *(undefined8 *)((long)this + 0x250) = 0;
  *(undefined8 *)((long)this + 600) = 0;
  *(undefined8 *)((long)this + 0x200) = 0;
  *(undefined8 *)((long)this + 0x208) = 0;
  *(undefined8 *)((long)this + 0x210) = 0;
  *(undefined8 *)((long)this + 0x218) = 0;
  *(undefined8 *)((long)this + 0x220) = 0;
  *(undefined8 *)((long)this + 0x228) = 0;
  *(undefined8 *)((long)this + 0x230) = 0;
  *(undefined8 *)((long)this + 0x238) = 0;
  *(undefined8 *)((long)this + 0x1c0) = 0;
  *(undefined8 *)((long)this + 0x1c8) = 0;
  *(undefined8 *)((long)this + 0x1d0) = 0;
  *(undefined8 *)((long)this + 0x1d8) = 0;
  *(undefined8 *)((long)this + 0x1e0) = 0;
  *(undefined8 *)((long)this + 0x1e8) = 0;
  *(undefined8 *)((long)this + 0x1f0) = 0;
  *(undefined8 *)((long)this + 0x1f8) = 0;
  *(undefined8 *)((long)this + 0x180) = 0;
  *(undefined8 *)((long)this + 0x188) = 0;
  *(undefined8 *)((long)this + 400) = 0;
  *(undefined8 *)((long)this + 0x198) = 0;
  *(undefined8 *)((long)this + 0x1a0) = 0;
  *(undefined8 *)((long)this + 0x1a8) = 0;
  *(undefined8 *)((long)this + 0x1b0) = 0;
  *(undefined8 *)((long)this + 0x1b8) = 0;
  *(undefined8 *)((long)this + 0x140) = 0;
  *(undefined8 *)((long)this + 0x148) = 0;
  *(undefined8 *)((long)this + 0x150) = 0;
  *(undefined8 *)((long)this + 0x158) = 0;
  *(undefined8 *)((long)this + 0x160) = 0;
  *(undefined8 *)((long)this + 0x168) = 0;
  *(undefined8 *)((long)this + 0x170) = 0;
  *(undefined8 *)((long)this + 0x178) = 0;
  auVar53 = *(undefined1 (*) [32])((long)this + 0x280);
  vscatterdpd_avx512vl
            (ZEXT832(this) + ZEXT832(0x140) + auVar63 * (undefined1  [32])0x8,0xffff,auVar53);
  vscatterdpd_avx512vl
            (ZEXT832(this) + ZEXT832(0x1a8) + auVar63 * (undefined1  [32])0x8,0xffff,auVar53);
  vscatterdpd_avx512vl
            (ZEXT832(this) + ZEXT832(0x210) + auVar63 * (undefined1  [32])0x8,0xffff,auVar53);
  local_d8 = *(double *)((long)this + 0x10);
  lStack_d0 = (long)this + 0x260;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,4,3,1,4,3>>,Eigen::Transpose<Eigen::Matrix<double,1,4,1,1,4>>,0>>
            (&local_48,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_4,_3,_1,_4,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_0>_>
              *)&local_d8,(type *)0x0);
  lStack_d0 = (long)this + 0x280;
  local_d8 = (double)*(undefined8 *)((long)this + 0x10);
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,4,3,1,4,3>>,Eigen::Transpose<Eigen::Matrix<double,1,4,1,1,4>>,0>>
            (&local_68,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_4,_3,_1,_4,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_0>_>
              *)&local_d8,(type *)0x0);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = local_48.m_data[0];
  auVar71._8_8_ = local_48.m_data[2];
  auVar71._0_8_ = local_48.m_data[2];
  auVar19._8_8_ = local_68.m_data[2];
  auVar19._0_8_ = local_68.m_data[1];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_68.m_data[0];
  auVar81._8_8_ = local_68.m_data[2];
  auVar81._0_8_ = local_68.m_data[2];
  auVar20._8_8_ = local_48.m_data[2];
  auVar20._0_8_ = local_48.m_data[1];
  auVar22 = vunpcklpd_avx(auVar71,auVar50);
  auVar17 = vunpcklpd_avx(auVar81,auVar43);
  auVar75._0_8_ = local_68.m_data[1] * auVar22._0_8_;
  auVar75._8_8_ = local_68.m_data[2] * auVar22._8_8_;
  auVar17 = vfmsub213pd_fma(auVar17,auVar20,auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = local_68.m_data[0] * local_48.m_data[1];
  auVar75 = vfmsub231sd_fma(auVar76,auVar50,auVar19);
  auVar44._0_8_ = auVar17._0_8_ * auVar17._0_8_;
  auVar44._8_8_ = auVar17._8_8_ * auVar17._8_8_;
  local_88 = ZEXT1632(auVar17);
  auVar22 = vshufpd_avx(auVar44,auVar44,1);
  auVar22 = vfmadd231sd_fma(auVar22,auVar17,auVar17);
  local_98 = vfmadd231sd_fma(auVar22,auVar75,auVar75);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_48.m_data[1] * local_48.m_data[1];
  auVar22 = vfmadd231sd_fma(auVar45,auVar50,auVar50);
  auVar22 = vfmadd231sd_fma(auVar22,auVar71,auVar71);
  auVar22 = vsqrtsd_avx(auVar22,auVar22);
  dVar42 = pow(auVar22._0_8_,3.0);
  pdVar8 = *(double **)((long)this + 0x10);
  auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar24 = vpbroadcastq_avx512f(ZEXT816(0xc));
  dVar48 = auVar22._0_8_ * 3.0;
  auVar22 = vmovhpd_avx(*(undefined1 (*) [16])((long)this + 0x260),
                        *(undefined8 *)((long)this + 0x270));
  auVar17 = vmovhpd_avx(*(undefined1 (*) [16])((long)this + 0x268),
                        *(undefined8 *)((long)this + 0x278));
  auVar77._8_8_ = 0;
  auVar77._0_8_ = pdVar8[5];
  auVar16 = vmovhpd_avx(auVar77,pdVar8[0xb]);
  auVar61._0_8_ = dVar48 * auVar22._0_8_;
  auVar61._8_8_ = dVar48 * auVar22._8_8_;
  auVar51._0_8_ = dVar48 * auVar17._0_8_;
  auVar51._8_8_ = dVar48 * auVar17._8_8_;
  auVar72._0_8_ = auVar61._0_8_ * *pdVar8;
  auVar72._8_8_ = auVar61._0_8_ * pdVar8[1];
  auVar68._8_8_ = auVar51._0_8_;
  auVar68._0_8_ = auVar51._0_8_;
  auVar17 = vfmadd132pd_fma(auVar68,auVar72,*(undefined1 (*) [16])(pdVar8 + 3));
  auVar22 = vshufpd_avx(auVar61,auVar61,3);
  auVar17 = vfmadd132pd_fma(auVar22,auVar17,*(undefined1 (*) [16])(pdVar8 + 6));
  auVar22 = vshufpd_avx(auVar51,auVar51,3);
  auVar17 = vfmadd132pd_fma(auVar22,auVar17,*(undefined1 (*) [16])(pdVar8 + 9));
  auVar73._8_8_ = 0;
  auVar73._0_8_ = pdVar8[2];
  auVar22 = vmovhpd_avx(auVar73,pdVar8[8]);
  dVar48 = auVar61._0_8_ * auVar22._0_8_ + auVar51._0_8_ * auVar16._0_8_;
  dVar56 = auVar61._8_8_ * auVar22._8_8_ + auVar51._8_8_ * auVar16._8_8_;
  auVar62._0_8_ = dVar48 + dVar56;
  auVar62._8_8_ = dVar48 + dVar56;
  vmovlpd_avx(auVar62);
  local_d8 = auVar17._0_8_;
  lStack_d0 = auVar17._8_8_;
  auVar74._8_8_ = lStack_d0;
  auVar74._0_8_ = lStack_d0;
  auVar74._16_8_ = lStack_d0;
  auVar74._24_8_ = lStack_d0;
  auVar53._0_8_ = local_d8 * *(double *)((long)this + 0x20);
  auVar53._8_8_ = local_d8 * *(double *)((long)this + 0x28);
  auVar53._16_8_ = local_d8 * *(double *)((long)this + 0x30);
  auVar53._24_8_ = local_d8 * *(double *)((long)this + 0x38);
  auVar22 = vfmadd231pd_fma(auVar53,*(undefined1 (*) [32])((long)this + 0x80),auVar74);
  auVar78._8_8_ = auVar62._0_8_;
  auVar78._0_8_ = auVar62._0_8_;
  auVar78._16_8_ = auVar62._0_8_;
  auVar78._24_8_ = auVar62._0_8_;
  auVar63._0_8_ = local_d8 * *(double *)((long)this + 0x40);
  auVar63._8_8_ = local_d8 * *(double *)((long)this + 0x48);
  auVar63._16_8_ = local_d8 * *(double *)((long)this + 0x50);
  auVar63._24_8_ = local_d8 * *(double *)((long)this + 0x58);
  auVar19 = vfmadd231pd_fma(ZEXT1632(auVar22),*(undefined1 (*) [32])((long)this + 0xe0),auVar78);
  auVar22 = vfmadd231pd_fma(auVar63,*(undefined1 (*) [32])((long)this + 0xa0),auVar74);
  auVar20 = vfmadd231pd_fma(ZEXT1632(auVar22),*(undefined1 (*) [32])((long)this + 0x100),auVar78);
  auVar69._0_8_ = local_d8 * *(double *)((long)this + 0x60);
  auVar69._8_8_ = local_d8 * *(double *)((long)this + 0x68);
  auVar69._16_8_ = local_d8 * *(double *)((long)this + 0x70);
  auVar69._24_8_ = local_d8 * *(double *)((long)this + 0x78);
  auVar22 = vfmadd231pd_fma(auVar69,*(undefined1 (*) [32])((long)this + 0xc0),auVar74);
  *(undefined1 (*) [32])((long)this + 0x2a0) = ZEXT1632(auVar19);
  auVar43 = vfmadd231pd_fma(ZEXT1632(auVar22),*(undefined1 (*) [32])((long)this + 0x120),auVar78);
  *(undefined1 (*) [32])((long)this + 0x2c0) = ZEXT1632(auVar20);
  *(undefined1 (*) [32])((long)this + 0x2e0) = ZEXT1632(auVar43);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_48.m_data[1];
  auVar25 = vbroadcastsd_avx512f(auVar22);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_48.m_data[0];
  auVar26 = vbroadcastsd_avx512f(auVar17);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_48.m_data[2];
  auVar27 = vbroadcastsd_avx512f(auVar16);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_68.m_data[1];
  auVar28 = vbroadcastsd_avx512f(auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_68.m_data[2];
  auVar29 = vbroadcastsd_avx512f(auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_68.m_data[0];
  auVar30 = vbroadcastsd_avx512f(auVar5);
  auVar92._0_8_ = auVar25._0_8_ ^ 0x8000000000000000;
  auVar92._8_8_ = auVar25._8_8_ ^ 0x8000000000000000;
  auVar91._0_8_ = auVar26._0_8_ ^ 0x8000000000000000;
  auVar91._8_8_ = auVar26._8_8_ ^ 0x8000000000000000;
  auVar90._0_8_ = auVar27._0_8_ ^ 0x8000000000000000;
  auVar90._8_8_ = auVar27._8_8_ ^ 0x8000000000000000;
  auVar31 = vbroadcastsd_avx512f(auVar90);
  auVar32 = vbroadcastsd_avx512f(auVar91);
  auVar33 = vbroadcastsd_avx512f(auVar92);
  do {
    auVar34 = vpbroadcastq_avx512f();
    auVar34 = vporq_avx512f(auVar34,auVar23);
    uVar18 = vpcmpuq_avx512f(auVar34,auVar24,1);
    plVar1 = (long *)((long)this + lVar21 * 8 + 0xe0);
    bVar9 = (byte)uVar18;
    auVar34._8_8_ = (ulong)((byte)(uVar18 >> 1) & 1) * plVar1[1];
    auVar34._0_8_ = (ulong)(bVar9 & 1) * *plVar1;
    auVar34._16_8_ = (ulong)((byte)(uVar18 >> 2) & 1) * plVar1[2];
    auVar34._24_8_ = (ulong)((byte)(uVar18 >> 3) & 1) * plVar1[3];
    auVar34._32_8_ = (ulong)((byte)(uVar18 >> 4) & 1) * plVar1[4];
    auVar34._40_8_ = (ulong)((byte)(uVar18 >> 5) & 1) * plVar1[5];
    auVar34._48_8_ = (ulong)((byte)(uVar18 >> 6) & 1) * plVar1[6];
    auVar34._56_8_ = (uVar18 >> 7) * plVar1[7];
    plVar1 = (long *)((long)this + lVar21 * 8 + 0x80);
    auVar38._8_8_ = (ulong)((byte)(uVar18 >> 1) & 1) * plVar1[1];
    auVar38._0_8_ = (ulong)(bVar9 & 1) * *plVar1;
    auVar38._16_8_ = (ulong)((byte)(uVar18 >> 2) & 1) * plVar1[2];
    auVar38._24_8_ = (ulong)((byte)(uVar18 >> 3) & 1) * plVar1[3];
    auVar38._32_8_ = (ulong)((byte)(uVar18 >> 4) & 1) * plVar1[4];
    auVar38._40_8_ = (ulong)((byte)(uVar18 >> 5) & 1) * plVar1[5];
    auVar38._48_8_ = (ulong)((byte)(uVar18 >> 6) & 1) * plVar1[6];
    auVar38._56_8_ = (uVar18 >> 7) * plVar1[7];
    plVar1 = (long *)((long)this + lVar21 * 8 + 0x20);
    auVar40._8_8_ = (ulong)((byte)(uVar18 >> 1) & 1) * plVar1[1];
    auVar40._0_8_ = (ulong)(bVar9 & 1) * *plVar1;
    auVar40._16_8_ = (ulong)((byte)(uVar18 >> 2) & 1) * plVar1[2];
    auVar40._24_8_ = (ulong)((byte)(uVar18 >> 3) & 1) * plVar1[3];
    auVar40._32_8_ = (ulong)((byte)(uVar18 >> 4) & 1) * plVar1[4];
    auVar40._40_8_ = (ulong)((byte)(uVar18 >> 5) & 1) * plVar1[5];
    auVar40._48_8_ = (ulong)((byte)(uVar18 >> 6) & 1) * plVar1[6];
    auVar40._56_8_ = (uVar18 >> 7) * plVar1[7];
    plVar1 = (long *)((long)this + lVar21 * 8 + 0x1a0);
    auVar41._8_8_ = (ulong)((byte)(uVar18 >> 1) & 1) * plVar1[1];
    auVar41._0_8_ = (ulong)(bVar9 & 1) * *plVar1;
    auVar41._16_8_ = (ulong)((byte)(uVar18 >> 2) & 1) * plVar1[2];
    auVar41._24_8_ = (ulong)((byte)(uVar18 >> 3) & 1) * plVar1[3];
    auVar41._32_8_ = (ulong)((byte)(uVar18 >> 4) & 1) * plVar1[4];
    auVar41._40_8_ = (ulong)((byte)(uVar18 >> 5) & 1) * plVar1[5];
    auVar41._48_8_ = (ulong)((byte)(uVar18 >> 6) & 1) * plVar1[6];
    auVar41._56_8_ = (uVar18 >> 7) * plVar1[7];
    plVar1 = (long *)((long)this + lVar21 * 8 + 0x200);
    auVar39._8_8_ = (ulong)((byte)(uVar18 >> 1) & 1) * plVar1[1];
    auVar39._0_8_ = (ulong)(bVar9 & 1) * *plVar1;
    auVar39._16_8_ = (ulong)((byte)(uVar18 >> 2) & 1) * plVar1[2];
    auVar39._24_8_ = (ulong)((byte)(uVar18 >> 3) & 1) * plVar1[3];
    auVar39._32_8_ = (ulong)((byte)(uVar18 >> 4) & 1) * plVar1[4];
    auVar39._40_8_ = (ulong)((byte)(uVar18 >> 5) & 1) * plVar1[5];
    auVar39._48_8_ = (ulong)((byte)(uVar18 >> 6) & 1) * plVar1[6];
    auVar39._56_8_ = (uVar18 >> 7) * plVar1[7];
    auVar35 = vmulpd_avx512f(auVar28,auVar34);
    auVar36 = vmulpd_avx512f(auVar29,auVar40);
    auVar37 = vmulpd_avx512f(auVar41,auVar31);
    auVar35 = vfmsub231pd_avx512f(auVar35,auVar38,auVar29);
    auVar38 = vmulpd_avx512f(auVar30,auVar38);
    auVar37 = vfmadd231pd_avx512f(auVar37,auVar25,auVar39);
    auVar39 = vmulpd_avx512f(auVar39,auVar32);
    auVar34 = vfmsub231pd_avx512f(auVar36,auVar30,auVar34);
    auVar38 = vfmsub231pd_avx512f(auVar38,auVar28,auVar40);
    plVar1 = (long *)((long)this + lVar21 * 8 + 0x140);
    auVar36._8_8_ = (ulong)((byte)(uVar18 >> 1) & 1) * plVar1[1];
    auVar36._0_8_ = (ulong)(bVar9 & 1) * *plVar1;
    auVar36._16_8_ = (ulong)((byte)(uVar18 >> 2) & 1) * plVar1[2];
    auVar36._24_8_ = (ulong)((byte)(uVar18 >> 3) & 1) * plVar1[3];
    auVar36._32_8_ = (ulong)((byte)(uVar18 >> 4) & 1) * plVar1[4];
    auVar36._40_8_ = (ulong)((byte)(uVar18 >> 5) & 1) * plVar1[5];
    auVar36._48_8_ = (ulong)((byte)(uVar18 >> 6) & 1) * plVar1[6];
    auVar36._56_8_ = (uVar18 >> 7) * plVar1[7];
    auVar40 = vaddpd_avx512f(auVar35,auVar37);
    puVar2 = (ulong *)((long)this + lVar21 * 8 + 0x3c0);
    bVar10 = (bool)((byte)(uVar18 >> 1) & 1);
    bVar11 = (bool)((byte)(uVar18 >> 2) & 1);
    bVar12 = (bool)((byte)(uVar18 >> 3) & 1);
    bVar13 = (bool)((byte)(uVar18 >> 4) & 1);
    bVar14 = (bool)((byte)(uVar18 >> 5) & 1);
    bVar15 = (bool)((byte)(uVar18 >> 6) & 1);
    *puVar2 = (ulong)(bVar9 & 1) * auVar40._0_8_ | (ulong)!(bool)(bVar9 & 1) * *puVar2;
    puVar2[1] = (ulong)bVar10 * auVar40._8_8_ | (ulong)!bVar10 * puVar2[1];
    puVar2[2] = (ulong)bVar11 * auVar40._16_8_ | (ulong)!bVar11 * puVar2[2];
    puVar2[3] = (ulong)bVar12 * auVar40._24_8_ | (ulong)!bVar12 * puVar2[3];
    puVar2[4] = (ulong)bVar13 * auVar40._32_8_ | (ulong)!bVar13 * puVar2[4];
    puVar2[5] = (ulong)bVar14 * auVar40._40_8_ | (ulong)!bVar14 * puVar2[5];
    puVar2[6] = (ulong)bVar15 * auVar40._48_8_ | (ulong)!bVar15 * puVar2[6];
    puVar2[7] = (uVar18 >> 7) * auVar40._56_8_ | (ulong)!SUB81(uVar18 >> 7,0) * puVar2[7];
    auVar40 = vfmadd231pd_avx512f(auVar39,auVar27,auVar36);
    auVar39 = vmulpd_avx512f(auVar36,auVar33);
    auVar41 = vfmadd231pd_avx512f(auVar39,auVar26,auVar41);
    auVar34 = vaddpd_avx512f(auVar34,auVar40);
    auVar38 = vaddpd_avx512f(auVar38,auVar41);
    puVar2 = (ulong *)((long)this + lVar21 * 8 + 0x420);
    bVar10 = (bool)((byte)(uVar18 >> 1) & 1);
    bVar11 = (bool)((byte)(uVar18 >> 2) & 1);
    bVar12 = (bool)((byte)(uVar18 >> 3) & 1);
    bVar13 = (bool)((byte)(uVar18 >> 4) & 1);
    bVar14 = (bool)((byte)(uVar18 >> 5) & 1);
    bVar15 = (bool)((byte)(uVar18 >> 6) & 1);
    *puVar2 = (ulong)(bVar9 & 1) * auVar34._0_8_ | (ulong)!(bool)(bVar9 & 1) * *puVar2;
    puVar2[1] = (ulong)bVar10 * auVar34._8_8_ | (ulong)!bVar10 * puVar2[1];
    puVar2[2] = (ulong)bVar11 * auVar34._16_8_ | (ulong)!bVar11 * puVar2[2];
    puVar2[3] = (ulong)bVar12 * auVar34._24_8_ | (ulong)!bVar12 * puVar2[3];
    puVar2[4] = (ulong)bVar13 * auVar34._32_8_ | (ulong)!bVar13 * puVar2[4];
    puVar2[5] = (ulong)bVar14 * auVar34._40_8_ | (ulong)!bVar14 * puVar2[5];
    puVar2[6] = (ulong)bVar15 * auVar34._48_8_ | (ulong)!bVar15 * puVar2[6];
    puVar2[7] = (uVar18 >> 7) * auVar34._56_8_ | (ulong)!SUB81(uVar18 >> 7,0) * puVar2[7];
    puVar2 = (ulong *)((long)this + lVar21 * 8 + 0x480);
    bVar10 = (bool)((byte)(uVar18 >> 1) & 1);
    bVar11 = (bool)((byte)(uVar18 >> 2) & 1);
    bVar12 = (bool)((byte)(uVar18 >> 3) & 1);
    bVar13 = (bool)((byte)(uVar18 >> 4) & 1);
    bVar14 = (bool)((byte)(uVar18 >> 5) & 1);
    bVar15 = (bool)((byte)(uVar18 >> 6) & 1);
    *puVar2 = (ulong)(bVar9 & 1) * auVar38._0_8_ | (ulong)!(bool)(bVar9 & 1) * *puVar2;
    puVar2[1] = (ulong)bVar10 * auVar38._8_8_ | (ulong)!bVar10 * puVar2[1];
    puVar2[2] = (ulong)bVar11 * auVar38._16_8_ | (ulong)!bVar11 * puVar2[2];
    puVar2[3] = (ulong)bVar12 * auVar38._24_8_ | (ulong)!bVar12 * puVar2[3];
    puVar2[4] = (ulong)bVar13 * auVar38._32_8_ | (ulong)!bVar13 * puVar2[4];
    puVar2[5] = (ulong)bVar14 * auVar38._40_8_ | (ulong)!bVar14 * puVar2[5];
    puVar2[6] = (ulong)bVar15 * auVar38._48_8_ | (ulong)!bVar15 * puVar2[6];
    puVar2[7] = (uVar18 >> 7) * auVar38._56_8_ | (ulong)!SUB81(uVar18 >> 7,0) * puVar2[7];
    lVar21 = lVar21 + 8;
  } while (lVar21 != 0x10);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_98._0_8_;
  auVar22 = vsqrtsd_avx512f(in_XMM23,auVar6);
  dVar48 = auVar22._0_8_;
  local_f8 = auVar75._0_8_;
  if ((dVar48 != 0.0) || (NAN(dVar48))) {
    dVar56 = 1.0 / dVar48;
    dVar47 = dVar56 * (double)local_88._0_8_;
    dVar49 = dVar56 * (double)local_88._8_8_;
    dVar56 = dVar56 * local_f8;
    auVar87._8_8_ = dVar49;
    auVar87._0_8_ = dVar49;
    auVar87._16_8_ = dVar49;
    auVar87._24_8_ = dVar49;
    auVar80._0_8_ = dVar47 * *(double *)((long)this + 0x3c0);
    auVar80._8_8_ = dVar47 * *(double *)((long)this + 0x3c8);
    auVar80._16_8_ = dVar47 * *(double *)((long)this + 0x3d0);
    auVar80._24_8_ = dVar47 * *(double *)((long)this + 0x3d8);
    auVar17 = vfmadd231pd_fma(auVar80,*(undefined1 (*) [32])((long)this + 0x420),auVar87);
    auVar89._8_8_ = dVar56;
    auVar89._0_8_ = dVar56;
    auVar89._16_8_ = dVar56;
    auVar89._24_8_ = dVar56;
    auVar83._0_8_ = dVar47 * *(double *)((long)this + 0x3e0);
    auVar83._8_8_ = dVar47 * *(double *)((long)this + 1000);
    auVar83._16_8_ = dVar47 * *(double *)((long)this + 0x3f0);
    auVar83._24_8_ = dVar47 * *(double *)((long)this + 0x3f8);
    auVar3 = vfmadd231pd_fma(ZEXT1632(auVar17),*(undefined1 (*) [32])((long)this + 0x480),auVar89);
    auVar17 = vfmadd231pd_fma(auVar83,*(undefined1 (*) [32])((long)this + 0x440),auVar87);
    auVar16 = vfmadd231pd_fma(ZEXT1632(auVar17),*(undefined1 (*) [32])((long)this + 0x4a0),auVar89);
    auVar85._0_8_ = dVar47 * *(double *)((long)this + 0x400);
    auVar85._8_8_ = dVar47 * *(double *)((long)this + 0x408);
    auVar85._16_8_ = dVar47 * *(double *)((long)this + 0x410);
    auVar85._24_8_ = dVar47 * *(double *)((long)this + 0x418);
    auVar17 = vfmadd231pd_fma(auVar85,*(undefined1 (*) [32])((long)this + 0x460),auVar87);
    auVar17 = vfmadd231pd_fma(ZEXT1632(auVar17),*(undefined1 (*) [32])((long)this + 0x4c0),auVar89);
  }
  else {
    auVar93._8_8_ = local_f8;
    auVar93._0_8_ = local_f8;
    auVar93._16_8_ = local_f8;
    auVar93._24_8_ = local_f8;
    auVar53 = vpermpd_avx2(local_88,0x55);
    auVar79._0_8_ = (double)local_88._0_8_ * *(double *)((long)this + 0x3c0);
    auVar79._8_8_ = (double)local_88._0_8_ * *(double *)((long)this + 0x3c8);
    auVar79._16_8_ = (double)local_88._0_8_ * *(double *)((long)this + 0x3d0);
    auVar79._24_8_ = (double)local_88._0_8_ * *(double *)((long)this + 0x3d8);
    auVar17 = vfmadd231pd_fma(auVar79,*(undefined1 (*) [32])((long)this + 0x420),auVar53);
    auVar82._0_8_ = (double)local_88._0_8_ * *(double *)((long)this + 0x3e0);
    auVar82._8_8_ = (double)local_88._0_8_ * *(double *)((long)this + 1000);
    auVar82._16_8_ = (double)local_88._0_8_ * *(double *)((long)this + 0x3f0);
    auVar82._24_8_ = (double)local_88._0_8_ * *(double *)((long)this + 0x3f8);
    auVar3 = vfmadd231pd_fma(ZEXT1632(auVar17),*(undefined1 (*) [32])((long)this + 0x480),auVar93);
    auVar17 = vfmadd231pd_fma(auVar82,*(undefined1 (*) [32])((long)this + 0x440),auVar53);
    auVar16 = vfmadd231pd_fma(ZEXT1632(auVar17),*(undefined1 (*) [32])((long)this + 0x4a0),auVar93);
    auVar84._0_8_ = (double)local_88._0_8_ * *(double *)((long)this + 0x400);
    auVar84._8_8_ = (double)local_88._0_8_ * *(double *)((long)this + 0x408);
    auVar84._16_8_ = (double)local_88._0_8_ * *(double *)((long)this + 0x410);
    auVar84._24_8_ = (double)local_88._0_8_ * *(double *)((long)this + 0x418);
    auVar17 = vfmadd231pd_fma(auVar84,*(undefined1 (*) [32])((long)this + 0x460),auVar53);
    auVar17 = vfmadd231pd_fma(ZEXT1632(auVar17),*(undefined1 (*) [32])((long)this + 0x4c0),auVar93);
  }
  auVar86._0_8_ = dVar48 / dVar42;
  auVar86._8_8_ = auVar22._8_8_;
  *(undefined1 (*) [32])((long)this + 0x300) = ZEXT1632(auVar3);
  *(undefined1 (*) [32])((long)this + 800) = ZEXT1632(auVar16);
  *(undefined1 (*) [32])((long)this + 0x340) = ZEXT1632(auVar17);
  auVar54._0_8_ = dVar48 * auVar19._0_8_;
  auVar54._8_8_ = dVar48 * auVar19._8_8_;
  auVar54._16_8_ = dVar48 * 0.0;
  auVar54._24_8_ = dVar48 * 0.0;
  auVar64._0_8_ = dVar48 * auVar20._0_8_;
  auVar64._8_8_ = dVar48 * auVar20._8_8_;
  auVar64._16_8_ = dVar48 * 0.0;
  auVar64._24_8_ = dVar48 * 0.0;
  auVar70._0_8_ = dVar48 * auVar43._0_8_;
  auVar70._8_8_ = dVar48 * auVar43._8_8_;
  auVar70._16_8_ = dVar48 * 0.0;
  auVar70._24_8_ = dVar48 * 0.0;
  dVar88 = 1.0 / (dVar42 * dVar42);
  auVar46._0_8_ = dVar42 * auVar3._0_8_;
  auVar46._8_8_ = dVar42 * auVar3._8_8_;
  auVar46._16_8_ = dVar42 * 0.0;
  auVar46._24_8_ = dVar42 * 0.0;
  auVar53 = vsubpd_avx(auVar46,auVar54);
  auVar55._0_8_ = dVar42 * auVar16._0_8_;
  auVar55._8_8_ = dVar42 * auVar16._8_8_;
  auVar55._16_8_ = dVar42 * 0.0;
  auVar55._24_8_ = dVar42 * 0.0;
  auVar63 = vsubpd_avx(auVar55,auVar64);
  auVar65._0_8_ = dVar42 * auVar17._0_8_;
  auVar65._8_8_ = dVar42 * auVar17._8_8_;
  auVar65._16_8_ = dVar42 * 0.0;
  auVar65._24_8_ = dVar42 * 0.0;
  auVar69 = vsubpd_avx(auVar65,auVar70);
  dVar48 = dVar88 * auVar53._0_8_;
  dVar42 = dVar88 * auVar53._8_8_;
  dVar56 = dVar88 * auVar53._16_8_;
  dVar47 = dVar88 * auVar53._24_8_;
  dVar49 = dVar88 * auVar63._0_8_;
  dVar57 = dVar88 * auVar63._8_8_;
  dVar58 = dVar88 * auVar63._16_8_;
  dVar59 = dVar88 * auVar63._24_8_;
  dVar60 = dVar88 * auVar69._0_8_;
  dVar66 = dVar88 * auVar69._8_8_;
  dVar67 = dVar88 * auVar69._16_8_;
  dVar88 = dVar88 * auVar69._24_8_;
  *(double *)((long)this + 0x360) = dVar48;
  *(double *)((long)this + 0x368) = dVar42;
  *(double *)((long)this + 0x370) = dVar56;
  *(double *)((long)this + 0x378) = dVar47;
  *(double *)((long)this + 0x380) = dVar49;
  *(double *)((long)this + 0x388) = dVar57;
  *(double *)((long)this + 0x390) = dVar58;
  *(double *)((long)this + 0x398) = dVar59;
  *(double *)((long)this + 0x3a0) = dVar60;
  *(double *)((long)this + 0x3a8) = dVar66;
  *(double *)((long)this + 0x3b0) = dVar67;
  *(double *)((long)this + 0x3b8) = dVar88;
  if (*(char *)(*(long *)((long)this + 8) + 0x60) == '\x01') {
    pdVar8 = *(double **)((long)this + 0x18);
    dVar49 = dVar48 * *pdVar8 + dVar49 * pdVar8[4] + dVar60 * pdVar8[8] +
             dVar56 * pdVar8[2] + dVar58 * pdVar8[6] + dVar67 * pdVar8[10];
    dVar57 = dVar42 * pdVar8[1] + dVar57 * pdVar8[5] + dVar66 * pdVar8[9] +
             dVar47 * pdVar8[3] + dVar59 * pdVar8[7] + dVar88 * pdVar8[0xb];
    auVar52._0_8_ = dVar49 + dVar57;
    auVar52._8_8_ = dVar49 + dVar57;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)(*(long *)((long)this + 8) + 0x68);
    auVar22 = vfmadd231sd_fma(auVar86,auVar52,auVar7);
    auVar86._0_8_ = auVar22._0_8_;
  }
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[0]
       = dVar48 * auVar86._0_8_;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[1]
       = dVar42 * auVar86._0_8_;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[2]
       = dVar56 * auVar86._0_8_;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[3]
       = dVar47 * auVar86._0_8_;
  dVar48 = *(double *)((long)this + 0x388);
  dVar42 = *(double *)((long)this + 0x390);
  dVar56 = *(double *)((long)this + 0x398);
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[4]
       = auVar86._0_8_ * *(double *)((long)this + 0x380);
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[5]
       = auVar86._0_8_ * dVar48;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[6]
       = auVar86._0_8_ * dVar42;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[7]
       = auVar86._0_8_ * dVar56;
  dVar48 = *(double *)((long)this + 0x3a8);
  dVar42 = *(double *)((long)this + 0x3b0);
  dVar56 = *(double *)((long)this + 0x3b8);
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[8]
       = auVar86._0_8_ * *(double *)((long)this + 0x3a0);
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array[9]
       = auVar86._0_8_ * dVar48;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array
  [10] = auVar86._0_8_ * dVar42;
  (result->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.array
  [0xb] = auVar86._0_8_ * dVar56;
  return;
}

Assistant:

virtual void Evaluate(ChVectorN<double, 12>& result, const double x) override {
            element->ShapeFunctionsDerivatives(Nd, x);
            element->ShapeFunctionsDerivatives2(Ndd, x);

            // Sd=[Nd1*eye(3) Nd2*eye(3) Nd3*eye(3) Nd4*eye(3)]
            // Sdd=[Ndd1*eye(3) Ndd2*eye(3) Ndd3*eye(3) Ndd4*eye(3)]
            Sd.setZero();
            for (int i = 0; i < 4; i++) {
                Sd(0, 3 * i + 0) = Nd(i);
                Sd(1, 3 * i + 1) = Nd(i);
                Sd(2, 3 * i + 2) = Nd(i);
            }

            Sdd.setZero();
            for (int i = 0; i < 4; i++) {
                Sdd(0, 3 * i + 0) = Ndd(i);
                Sdd(1, 3 * i + 1) = Ndd(i);
                Sdd(2, 3 * i + 2) = Ndd(i);
            }

            ChVector<> vr_x((*d).transpose() * Nd.transpose());
            ChVector<> vr_xx((*d).transpose() * Ndd.transpose());
            ChVector<> vf1 = Vcross(vr_x, vr_xx);
            double f = vf1.Length();
            double g1 = vr_x.Length();
            double g = pow(g1, 3);
            double k = f / g;

            g_e = (3 * g1) * Nd * (*d) * Sd;

            // do:  fe1=cross(Sd,r_xxrep)+cross(r_xrep,Sdd);
            for (int col = 0; col < 12; ++col) {
                ChVector<> Sd_i = Sd.col(col);
                fe1.col(col) = Vcross(Sd_i, vr_xx).eigen();
                ChVector<> Sdd_i = Sdd.col(col);
                fe1.col(col) += Vcross(vr_x, Sdd_i).eigen();
            }
            ChVectorN<double, 3> f1 = vf1.eigen();

            if (f == 0)
                f_e = f1.transpose() * fe1;
            else {
                f_e = (1 / f) * f1.transpose() * fe1;
            }

            k_e = (f_e * g - g_e * f) * (1 / (pow(g, 2)));

            // Add damping if selected by user: curvature rate
            if (element->m_use_damping)
                k += (element->m_alpha) * (k_e * (*d_dt))(0, 0);

            result = k * k_e.transpose();
        }